

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O1

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::SpotLight>::lerp
          (LightNodeImpl<embree::SceneGraph::SpotLight> *this,
          Ref<embree::SceneGraph::LightNode> *light1_in,float f)

{
  LightNode *pLVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  long *plVar27;
  _func_int **pp_Var28;
  long *in_RDX;
  float fVar29;
  
  if (*in_RDX == 0) {
    plVar27 = (long *)0x0;
  }
  else {
    plVar27 = (long *)__dynamic_cast(*in_RDX,&LightNode::typeinfo,&typeinfo,0);
  }
  if (plVar27 != (long *)0x0) {
    (**(code **)(*plVar27 + 0x10))(plVar27);
  }
  pp_Var28 = (_func_int **)alignedMalloc(0xc0,0x10);
  fVar29 = 1.0 - f;
  fVar3 = *(float *)(plVar27 + 0x10);
  fVar4 = *(float *)((long)plVar27 + 0x84);
  fVar5 = *(float *)(plVar27 + 0x11);
  fVar6 = *(float *)((long)plVar27 + 0x8c);
  fVar7 = *(float *)&light1_in[0x10].ptr;
  fVar8 = *(float *)((long)&light1_in[0x10].ptr + 4);
  fVar9 = *(float *)&light1_in[0x11].ptr;
  fVar10 = *(float *)((long)&light1_in[0x11].ptr + 4);
  fVar11 = *(float *)(plVar27 + 0x12);
  fVar12 = *(float *)((long)plVar27 + 0x94);
  fVar13 = *(float *)(plVar27 + 0x13);
  fVar14 = *(float *)((long)plVar27 + 0x9c);
  fVar15 = *(float *)&light1_in[0x12].ptr;
  fVar16 = *(float *)((long)&light1_in[0x12].ptr + 4);
  fVar17 = *(float *)&light1_in[0x13].ptr;
  fVar18 = *(float *)((long)&light1_in[0x13].ptr + 4);
  fVar19 = *(float *)(plVar27 + 0x14);
  fVar20 = *(float *)((long)plVar27 + 0xa4);
  fVar21 = *(float *)(plVar27 + 0x15);
  fVar22 = *(float *)((long)plVar27 + 0xac);
  fVar23 = *(float *)&light1_in[0x14].ptr;
  fVar24 = *(float *)((long)&light1_in[0x14].ptr + 4);
  fVar25 = *(float *)&light1_in[0x15].ptr;
  fVar26 = *(float *)((long)&light1_in[0x15].ptr + 4);
  pLVar1 = light1_in[0x16].ptr;
  lVar2 = plVar27[0x16];
  pp_Var28[1] = (_func_int *)0x0;
  pp_Var28[2] = (_func_int *)(pp_Var28 + 4);
  pp_Var28[3] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var28 + 4) = 0;
  pp_Var28[6] = (_func_int *)(pp_Var28 + 8);
  pp_Var28[7] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var28 + 8) = 0;
  pp_Var28[10] = (_func_int *)0x0;
  *(undefined2 *)(pp_Var28 + 0xb) = 0;
  *(undefined4 *)((long)pp_Var28 + 0x5c) = 0xffffffff;
  pp_Var28[0xc] = (_func_int *)0x0;
  *pp_Var28 = (_func_int *)&PTR__Node_0026eb08;
  *(undefined4 *)(pp_Var28 + 0xe) = 3;
  *(float *)(pp_Var28 + 0x10) = fVar7 * fVar29 + fVar3 * f;
  *(float *)((long)pp_Var28 + 0x84) = fVar8 * fVar29 + fVar4 * f;
  *(float *)(pp_Var28 + 0x11) = fVar9 * fVar29 + fVar5 * f;
  *(float *)((long)pp_Var28 + 0x8c) = fVar10 * fVar29 + fVar6 * f;
  *(float *)(pp_Var28 + 0x12) = fVar15 * fVar29 + fVar11 * f;
  *(float *)((long)pp_Var28 + 0x94) = fVar16 * fVar29 + fVar12 * f;
  *(float *)(pp_Var28 + 0x13) = fVar17 * fVar29 + fVar13 * f;
  *(float *)((long)pp_Var28 + 0x9c) = fVar18 * fVar29 + fVar14 * f;
  *(float *)(pp_Var28 + 0x14) = fVar23 * fVar29 + fVar19 * f;
  *(float *)((long)pp_Var28 + 0xa4) = fVar24 * fVar29 + fVar20 * f;
  *(float *)(pp_Var28 + 0x15) = fVar25 * fVar29 + fVar21 * f;
  *(float *)((long)pp_Var28 + 0xac) = fVar26 * fVar29 + fVar22 * f;
  pp_Var28[0x16] =
       (_func_int *)
       CONCAT44((float)((ulong)pLVar1 >> 0x20) * fVar29 + (float)((ulong)lVar2 >> 0x20) * f,
                SUB84(pLVar1,0) * fVar29 + (float)lVar2 * f);
  (this->super_LightNode).super_Node.super_RefCount._vptr_RefCount = pp_Var28;
  LOCK();
  pp_Var28[1] = pp_Var28[1] + 1;
  UNLOCK();
  if (plVar27 != (long *)0x0) {
    (**(code **)(*plVar27 + 0x18))(plVar27);
  }
  return (Ref<embree::SceneGraph::LightNode>)&this->super_LightNode;
}

Assistant:

virtual Ref<LightNode> lerp(const Ref<LightNode>& light1_in, float f) const
      {
        const Ref<LightNodeImpl<Light>> light1 = light1_in.dynamicCast<LightNodeImpl<Light>>();
        assert(light1);
        return new LightNodeImpl(Light::lerp(light,light1->light,f));
      }